

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O2

void __thiscall
MADPComponentDiscreteStates::SetNrStates(MADPComponentDiscreteStates *this,size_t nrS)

{
  StateDistributionVector *pSVar1;
  pointer pdVar2;
  ulong uVar3;
  allocator<char> local_da;
  allocator<char> local_d9;
  vector<StateDiscrete,_std::allocator<StateDiscrete>_> *local_d8;
  size_t local_d0;
  string local_c8;
  string local_a8;
  StateDiscrete local_88;
  
  this->_m_nrStates = nrS;
  local_d8 = &this->_m_stateVec;
  local_d0 = nrS;
  std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>::clear(local_d8);
  pSVar1 = this->_m_initialStateDistribution;
  if (pSVar1 == (StateDistributionVector *)0x0) {
    pSVar1 = (StateDistributionVector *)operator_new(0x20);
    (pSVar1->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pSVar1->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar1->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar1->super_StateDistribution)._vptr_StateDistribution =
         (_func_int **)&PTR__StateDistributionVector_005d38d8;
    pdVar2 = (pointer)0x0;
    this->_m_initialStateDistribution = pSVar1;
  }
  else {
    pdVar2 = (pSVar1->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  if ((pSVar1->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (pSVar1->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  for (uVar3 = 0; uVar3 < local_d0; uVar3 = (ulong)((Index)uVar3 + 1)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"undefined",&local_d9);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"undefined",&local_da);
    StateDiscrete::StateDiscrete(&local_88,(Index)uVar3,&local_a8,&local_c8);
    std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>::emplace_back<StateDiscrete>
              (local_d8,&local_88);
    NamedDescribedEntity::~NamedDescribedEntity((NamedDescribedEntity *)&local_88);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    local_88.super_State.super_NamedDescribedEntity._vptr_NamedDescribedEntity = (_func_int **)0x0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&this->_m_initialStateDistribution->super_SDV,(double *)&local_88);
  }
  this->_m_initialized = true;
  return;
}

Assistant:

void MADPComponentDiscreteStates::SetNrStates(size_t nrS)
{
    _m_nrStates = nrS;
    _m_stateVec.clear();
    if(_m_initialStateDistribution == 0)
        _m_initialStateDistribution = new StateDistributionVector();

    _m_initialStateDistribution->clear();
    for(Index i=0; i < nrS; i++)
    {
        _m_stateVec.push_back(StateDiscrete(i));
        _m_initialStateDistribution->push_back(0.0);
    }
    _m_initialized = true;
}